

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUSSEImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUSSEImpl<double,_2,_0>::calcPartialsPartialsAutoScaling
          (BeagleCPUSSEImpl<double,_2,_0> *this,double *destP,double *partials_q,double *matrices_q,
          double *partials_r,double *matrices_r,int *activateScaling)

{
  double *in_RDI;
  double *unaff_retaddr;
  
  BeagleCPUImpl<double,_2,_0>::calcPartialsPartialsAutoScaling
            ((BeagleCPUImpl<double,_2,_0> *)partials_q,matrices_q,partials_r,matrices_r,
             unaff_retaddr,in_RDI,(int *)this);
  return;
}

Assistant:

BEAGLE_CPU_SSE_TEMPLATE
void BeagleCPUSSEImpl<BEAGLE_CPU_SSE_DOUBLE>::calcPartialsPartialsAutoScaling(double* destP,
                                                         const double*  partials_q,
                                                         const double*  matrices_q,
                                                         const double*  partials_r,
                                                         const double*  matrices_r,
                                                                  int* activateScaling) {
    BeagleCPUImpl<BEAGLE_CPU_SSE_DOUBLE>::calcPartialsPartialsAutoScaling(destP,
                                                     partials_q,
                                                     matrices_q,
                                                     partials_r,
                                                     matrices_r,
                                                     activateScaling);
}